

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

bool __thiscall
spirv_cross::ParsedIR::has_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  Meta *pMVar1;
  _Node_iterator_base<unsigned_int,_false> _Var2;
  Bitset *pBVar3;
  Decoration local_1c;
  
  pMVar1 = find_meta(this,(ID)id.id);
  if ((pMVar1 == (Meta *)0x0) ||
     ((pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= (ulong)index)
     ) {
    pBVar3 = &this->cleared_bitset;
  }
  else {
    pBVar3 = &(pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[index].
              decoration_flags;
  }
  if (decoration < 0x40) {
    _Var2._M_cur = (__node_type *)(pBVar3->lower >> ((ulong)decoration & 0x3f) & 1);
  }
  else {
    local_1c = decoration;
    _Var2._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(pBVar3->higher)._M_h,&local_1c);
  }
  return _Var2._M_cur != (__node_type *)0x0;
}

Assistant:

bool ParsedIR::has_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	return get_member_decoration_bitset(id, index).get(decoration);
}